

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_capa_assert(FIOBJ str,size_t size)

{
  fio_str_info_s state;
  fio_str_info_s local_20;
  
  if (((uint)str & 7) == 2) {
    if (*(char *)((str & 0xfffffffffffffff8) + 0x11) == '\0') {
      fio_str_capa_assert(&local_20,(fio_str_s_conflict *)((str & 0xfffffffffffffff8) + 0x10),size);
    }
    else {
      local_20.capa = 0;
    }
    return local_20.capa;
  }
  __assert_fail("FIOBJ_TYPE_IS(str, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0xce,"size_t fiobj_str_capa_assert(FIOBJ, size_t)");
}

Assistant:

size_t fiobj_str_capa_assert(FIOBJ str, size_t size) {

  assert(FIOBJ_TYPE_IS(str, FIOBJ_T_STRING));
  if (obj2str(str)->str.frozen)
    return 0;
  fio_str_info_s state = fio_str_capa_assert(&obj2str(str)->str, size);
  return state.capa;
}